

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void clear_vec_high(DisasContext_conflict1 *s,_Bool is_q,int rd)

{
  TCGContext_conflict1 *tcg_ctx_00;
  int iVar1;
  uint uVar2;
  TCGv_i64 arg1;
  TCGv_i64 tcg_zero;
  uint vsz;
  uint ofs;
  TCGContext_conflict1 *tcg_ctx;
  int rd_local;
  _Bool is_q_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  iVar1 = fp_reg_offset(s,rd,MO_64);
  uVar2 = vec_full_reg_size(s);
  if (!is_q) {
    arg1 = tcg_const_i64_aarch64(tcg_ctx_00,0);
    tcg_gen_st_i64_aarch64(tcg_ctx_00,arg1,tcg_ctx_00->cpu_env,(ulong)(iVar1 + 8));
    tcg_temp_free_i64(tcg_ctx_00,arg1);
  }
  if (0x10 < uVar2) {
    tcg_gen_gvec_dup8i_aarch64(tcg_ctx_00,iVar1 + 0x10,uVar2 - 0x10,uVar2 - 0x10,'\0');
  }
  return;
}

Assistant:

static void clear_vec_high(DisasContext *s, bool is_q, int rd)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    unsigned ofs = fp_reg_offset(s, rd, MO_64);
    unsigned vsz = vec_full_reg_size(s);

    if (!is_q) {
        TCGv_i64 tcg_zero = tcg_const_i64(tcg_ctx, 0);
        tcg_gen_st_i64(tcg_ctx, tcg_zero, tcg_ctx->cpu_env, ofs + 8);
        tcg_temp_free_i64(tcg_ctx, tcg_zero);
    }
    if (vsz > 16) {
        tcg_gen_gvec_dup8i(tcg_ctx, ofs + 16, vsz - 16, vsz - 16, 0);
    }
}